

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

string * __thiscall
Catch::Matchers::WithinAbsMatcher::describe_abi_cxx11_
          (string *__return_storage_ptr__,WithinAbsMatcher *this)

{
  size_type *psVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  ulong *puVar5;
  StringMaker<double,void> *this_00;
  ulong uVar6;
  undefined8 uVar7;
  ulong *local_a0;
  long local_98;
  ulong local_90;
  long lStack_88;
  string local_80;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  string local_40;
  
  StringMaker<double,void>::convert_abi_cxx11_
            (&local_40,(StringMaker<double,void> *)this,this->m_margin);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x1807ac);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_50 = *plVar4;
    lStack_48 = plVar2[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar4;
    local_60 = (long *)*plVar2;
  }
  local_58 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  this_00 = (StringMaker<double,void> *)0x18081d;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_60);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_90 = *puVar5;
    lStack_88 = plVar2[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *puVar5;
    local_a0 = (ulong *)*plVar2;
  }
  local_98 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  StringMaker<double,void>::convert_abi_cxx11_(&local_80,this_00,this->m_target);
  uVar6 = 0xf;
  if (local_a0 != &local_90) {
    uVar6 = local_90;
  }
  if (uVar6 < local_80._M_string_length + local_98) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      uVar7 = local_80.field_2._M_allocated_capacity;
    }
    if (local_80._M_string_length + local_98 <= (ulong)uVar7) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_a0);
      goto LAB_0014f9a1;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_80._M_dataplus._M_p);
LAB_0014f9a1:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar1) {
    uVar7 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar7;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string WithinAbsMatcher::describe() const {
        return "is within " + ::Catch::Detail::stringify(m_margin) + " of " + ::Catch::Detail::stringify(m_target);
    }